

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O1

long __thiscall
duckdb::DateDiffTernaryOperator::
Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long>
          (DateDiffTernaryOperator *this,string_t part,timestamp_t startdate,timestamp_t enddate,
          ValidityMask *mask,idx_t idx)

{
  ulong *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  DatePartSpecifier DVar6;
  date_t dVar7;
  date_t dVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  int64_t iVar10;
  int64_t left;
  NotImplementedException *this_01;
  long lVar11;
  timestamp_t input;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined8 local_78;
  long local_70;
  string local_68;
  string local_48;
  
  input.value = part.value._8_8_;
  local_70 = part.value._0_8_;
  local_78 = this;
  bVar5 = Value::IsFinite<duckdb::timestamp_t>(input);
  if ((!bVar5) || (bVar5 = Value::IsFinite<duckdb::timestamp_t>(startdate), !bVar5)) {
    if (*(long *)enddate.value == 0) {
      local_48._M_dataplus._M_p = *(pointer *)(enddate.value + 0x18);
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_68,(unsigned_long *)&local_48);
      sVar4 = local_68._M_string_length;
      _Var3._M_p = local_68._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(enddate.value + 0x10);
      *(pointer *)(enddate.value + 8) = _Var3._M_p;
      *(size_type *)(enddate.value + 0x10) = sVar4;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
      }
      pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                          (enddate.value + 8));
      *(unsigned_long **)enddate.value =
           (unsigned_long *)
           (pTVar9->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    bVar2 = (byte)mask & 0x3f;
    puVar1 = (ulong *)(*(long *)enddate.value + ((ulong)mask >> 6) * 8);
    *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
    return 0;
  }
  lVar14 = local_70;
  if (((ulong)local_78 & 0xffffffff) < 0xd) {
    lVar14 = (long)&local_78 + 4;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,lVar14,((ulong)local_78 & 0xffffffff) + lVar14);
  DVar6 = GetDatePartSpecifier(&local_48);
  if (JULIAN_DAY < DVar6) {
switchD_01a034a0_caseD_12:
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Specifier type not implemented for DATEDIFF","");
    NotImplementedException::NotImplementedException(this_01,&local_68);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  lVar15 = startdate.value >> 0x3f;
  lVar14 = input.value >> 0x3f;
  switch(DVar6) {
  case BEGIN_BIGINT:
    iVar10 = DateDiff::YearOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                       (input,startdate);
    break;
  case MONTH:
    iVar10 = DateDiff::MonthOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                       (input,startdate);
    break;
  default:
    iVar10 = DateDiff::DayOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                       (input,startdate);
    break;
  case DECADE:
    iVar10 = DateDiff::DecadeOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                       (input,startdate);
    break;
  case CENTURY:
    iVar10 = DateDiff::CenturyOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                       (input,startdate);
    break;
  case MILLENNIUM:
    iVar10 = DateDiff::MilleniumOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                       (input,startdate);
    break;
  case MICROSECONDS:
    iVar10 = Timestamp::GetEpochMicroSeconds(input);
    left = Timestamp::GetEpochMicroSeconds(startdate);
    iVar10 = SubtractOperatorOverflowCheck::Operation<long,long,long>(left,iVar10);
    break;
  case MILLISECONDS:
    lVar11 = (startdate.value - lVar15) / 1000;
    lVar12 = SUB168(SEXT816(input.value - lVar14) * SEXT816(-0x20c49ba5e353f7cf),8);
    lVar13 = lVar12 >> 7;
    goto LAB_01a03597;
  case SECOND:
  case BEGIN_DOUBLE:
    lVar11 = (startdate.value - lVar15) / 1000000;
    lVar12 = SUB168(SEXT816(input.value - lVar14) * SEXT816(-0x431bde82d7b634db),8);
    lVar13 = lVar12 >> 0x12;
LAB_01a03597:
    lVar13 = lVar13 - (lVar12 >> 0x3f);
LAB_01a036b7:
    iVar10 = (lVar15 - lVar14) + lVar13 + lVar11;
    break;
  case MINUTE:
    lVar11 = (startdate.value - lVar15) / 60000000;
    lVar12 = SUB168(SEXT816(input.value - lVar14) * SEXT816(0x70d59cc6bc5928d7),8) -
             (input.value - lVar14);
    lVar13 = lVar12 >> 0x19;
    goto LAB_01a036b1;
  case HOUR:
    lVar11 = (startdate.value - lVar15) / 3600000000;
    lVar12 = SUB168(SEXT816(input.value - lVar14) * SEXT816(0x674a40d3fc1ad63b),8) -
             (input.value - lVar14);
    lVar13 = lVar12 >> 0x1f;
LAB_01a036b1:
    lVar13 = lVar13 - (lVar12 >> 0x3f);
    goto LAB_01a036b7;
  case WEEK:
  case YEARWEEK:
    dVar7 = Timestamp::GetDate(input);
    dVar8 = Timestamp::GetDate(startdate);
    iVar10 = (int64_t)((dVar8.days - dVar7.days) / 7);
    break;
  case ISOYEAR:
    iVar10 = DateDiff::ISOYearOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                       (input,startdate);
    break;
  case QUARTER:
    iVar10 = DateDiff::QuarterOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                       (input,startdate);
    break;
  case ERA:
  case TIMEZONE:
  case TIMEZONE_HOUR:
  case TIMEZONE_MINUTE:
    goto switchD_01a034a0_caseD_12;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return iVar10;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return DifferenceDates<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}